

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

idx_t duckdb::BinaryExecutor::
      SelectFlatLoopSwitch<double,double,duckdb::GreaterThanEquals,true,false>
                (double *ldata,double *rdata,SelectionVector *sel,idx_t count,ValidityMask *mask,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  idx_t iVar1;
  
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel == (SelectionVector *)0x0) {
      iVar1 = SelectFlatLoop<double,double,duckdb::GreaterThanEquals,true,false,false,true>
                        (ldata,rdata,sel,count,mask,(SelectionVector *)0x0,false_sel);
      return iVar1;
    }
    iVar1 = SelectFlatLoop<double,double,duckdb::GreaterThanEquals,true,false,true,false>
                      (ldata,rdata,sel,count,mask,true_sel,false_sel);
  }
  else {
    iVar1 = SelectFlatLoop<double,double,duckdb::GreaterThanEquals,true,false,true,true>
                      (ldata,rdata,sel,count,mask,true_sel,false_sel);
  }
  return iVar1;
}

Assistant:

static inline idx_t SelectFlatLoopSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                         const SelectionVector *sel, idx_t count, ValidityMask &mask,
	                                         SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else if (true_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, false>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, false, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		}
	}